

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigRehash(Abc_Aig_t *pMan)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  Abc_Obj_t **__s;
  Abc_Obj_t *p0;
  Abc_Obj_t *p1;
  int *local_58;
  Abc_Obj_t *local_48;
  int local_40;
  int i;
  int Temp;
  int Counter;
  uint Key;
  int *pArray;
  Abc_Obj_t *pEnt2;
  Abc_Obj_t *pEnt;
  Abc_Obj_t **pBinsNew;
  Abc_Aig_t *pMan_local;
  
  __s = (Abc_Obj_t **)malloc((long)pMan->nBins << 3);
  memset(__s,0,(long)pMan->nBins << 3);
  i = 0;
  for (local_40 = 0; local_40 < pMan->nBins; local_40 = local_40 + 1) {
    pEnt2 = pMan->pBins[local_40];
    if (pEnt2 == (Abc_Obj_t *)0x0) {
      local_48 = (Abc_Obj_t *)0x0;
    }
    else {
      local_48 = pEnt2->pNext;
    }
    pArray = (int *)local_48;
    while (pEnt2 != (Abc_Obj_t *)0x0) {
      piVar2 = (pEnt2->vFanins).pArray;
      if (piVar2[1] < *piVar2) {
        iVar1 = *piVar2;
        *piVar2 = piVar2[1];
        piVar2[1] = iVar1;
        uVar3 = *(uint *)&pEnt2->field_0x14;
        *(uint *)&pEnt2->field_0x14 =
             *(uint *)&pEnt2->field_0x14 & 0xfffffbff |
             (*(uint *)&pEnt2->field_0x14 >> 0xb & 1) << 10;
        *(uint *)&pEnt2->field_0x14 =
             *(uint *)&pEnt2->field_0x14 & 0xfffff7ff | (uVar3 >> 10 & 1) << 0xb;
      }
      p0 = Abc_ObjChild0(pEnt2);
      p1 = Abc_ObjChild1(pEnt2);
      uVar3 = Abc_HashKey2(p0,p1,pMan->nBins);
      pEnt2->pNext = __s[uVar3];
      __s[uVar3] = pEnt2;
      i = i + 1;
      pEnt2 = (Abc_Obj_t *)pArray;
      if (pArray == (int *)0x0) {
        local_58 = (int *)0x0;
      }
      else {
        local_58 = *(int **)(pArray + 2);
      }
      pArray = local_58;
    }
  }
  if (i != pMan->nEntries) {
    __assert_fail("Counter == pMan->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x295,"void Abc_AigRehash(Abc_Aig_t *)");
  }
  if (pMan->pBins != (Abc_Obj_t **)0x0) {
    free(pMan->pBins);
    pMan->pBins = (Abc_Obj_t **)0x0;
  }
  pMan->pBins = __s;
  return;
}

Assistant:

void Abc_AigRehash( Abc_Aig_t * pMan )
{
    Abc_Obj_t ** pBinsNew;
    Abc_Obj_t * pEnt, * pEnt2;
    int * pArray;
    unsigned Key;
    int Counter, Temp, i;

    // allocate a new array
    pBinsNew = ABC_ALLOC( Abc_Obj_t *, pMan->nBins );
    memset( pBinsNew, 0, sizeof(Abc_Obj_t *) * pMan->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntrySafe( pMan->pBins[i], pEnt, pEnt2 )
        {
            // swap the fanins if needed
            pArray = pEnt->vFanins.pArray;
            if ( pArray[0] > pArray[1] )
            {
                Temp = pArray[0];
                pArray[0] = pArray[1];
                pArray[1] = Temp;
                Temp = pEnt->fCompl0;
                pEnt->fCompl0 = pEnt->fCompl1;
                pEnt->fCompl1 = Temp;
            }
            // rehash the node
            Key = Abc_HashKey2( Abc_ObjChild0(pEnt), Abc_ObjChild1(pEnt), pMan->nBins );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == pMan->nEntries );
    // replace the table and the parameters
    ABC_FREE( pMan->pBins );
    pMan->pBins = pBinsNew;
}